

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O2

void * __thiscall
google::protobuf::internal::SerialArena::
AllocateAligned<(google::protobuf::internal::AllocationClient)1>(SerialArena *this,size_t n)

{
  CachedBlock *pCVar1;
  bool bVar2;
  char *failure_msg;
  ulong uVar3;
  int line;
  void *ptr;
  
  if ((n & 7) == 0) {
    ptr = (this->ptr_)._M_b._M_p;
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl<char*,char*>
                            (&this->limit_,(char **)&ptr,"limit_ >= ptr()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      if (0xf < n) {
        uVar3 = 0x3f;
        if (n - 1 != 0) {
          for (; n - 1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar3 = (uVar3 ^ 0xffffffffffffffc0) + 0x3d;
        if (uVar3 < this->cached_block_length_) {
          pCVar1 = this->cached_blocks_[uVar3];
          if (pCVar1 != (CachedBlock *)0x0) {
            this->cached_blocks_[uVar3] = pCVar1->next;
            return pCVar1;
          }
        }
      }
      bVar2 = MaybeAllocateAligned(this,n,&ptr);
      if (!bVar2) {
        ptr = AllocateAlignedFallback(this,n);
      }
      return ptr;
    }
    line = 0x76;
  }
  else {
    failure_msg = "internal::ArenaAlignDefault::IsAligned(n)";
    line = 0x75;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&ptr,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&ptr);
}

Assistant:

void* AllocateAligned(size_t n) {
    ABSL_DCHECK(internal::ArenaAlignDefault::IsAligned(n));
    ABSL_DCHECK_GE(limit_, ptr());

    if (alloc_client == AllocationClient::kArray) {
      if (void* res = TryAllocateFromCachedBlock(n)) {
        return res;
      }
    }

    void* ptr;
    if (ABSL_PREDICT_TRUE(MaybeAllocateAligned(n, &ptr))) {
      return ptr;
    }
    return AllocateAlignedFallback(n);
  }